

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestSubmitHandler.cxx
# Opt level: O0

bool __thiscall
cmCTestSubmitHandler::SubmitUsingHTTP
          (cmCTestSubmitHandler *this,string *localprefix,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *files,string *remoteprefix,string *url)

{
  undefined1 *puVar1;
  cmCTest *pcVar2;
  bool bVar3;
  bool bVar4;
  bool bVar5;
  int iVar6;
  reference pbVar7;
  CURL_conflict *data;
  char *pcVar8;
  undefined8 uVar9;
  ulong uVar10;
  ostream *poVar11;
  long lVar12;
  cmState *this_00;
  unsigned_long uVar13;
  void *pvVar14;
  size_type sVar15;
  char __rhs;
  rep_conflict rVar16;
  int local_2474;
  char *local_2440;
  char *local_2408;
  string local_21e0 [32];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_21c0;
  undefined1 local_21a0 [8];
  ostringstream cmCTestLog_msg_13;
  string local_2028 [32];
  cmCTestLogWrite local_2008;
  undefined1 local_1ff8 [8];
  ostringstream cmCTestLog_msg_12;
  cmCTestLogWrite local_1e80;
  string local_1e70 [32];
  undefined1 local_1e50 [8];
  ostringstream cmCTestLog_msg_11;
  string local_1cd8 [32];
  undefined1 local_1cb8 [8];
  ostringstream cmCTestLog_msg_10;
  vector<char,_std::allocator<char>_> local_1b40;
  string local_1b28 [32];
  cmCTestLogWrite local_1b08;
  undefined1 local_1af8 [8];
  ostringstream cmCTestLog_msg_9;
  string local_1980 [32];
  undefined1 local_1960 [8];
  ostringstream cmCTestLog_msg_8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_17e8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<long,_std::ratio<1L,_1000000000L>_>_>
  local_17e0;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  local_17d8;
  time_point<std::chrono::_V2::steady_clock,_std::chrono::duration<double,_std::ratio<1L,_1000000000L>_>_>
  stop;
  undefined1 local_17b0 [8];
  ostringstream cmCTestLog_msg_7;
  int local_1638;
  allocator<char> local_1631;
  int i;
  string local_1610;
  int local_15f0;
  byte local_15ec;
  byte local_15eb;
  byte local_15ea;
  allocator<char> local_15e9;
  int count;
  string local_15c8;
  int local_15a4;
  duration<double,_std::ratio<1L,_1L>_> local_15a0;
  cmDuration delay;
  string local_1590;
  allocator<char> local_1569;
  string local_1568;
  string local_1548 [8];
  string retryCount;
  string local_1520;
  allocator<char> local_14f9;
  string local_14f8;
  string local_14d8 [8];
  string retryDelay;
  cmCTestLogWrite local_1498;
  undefined1 local_1488 [8];
  ostringstream cmCTestLog_msg_6;
  vector<char,_std::allocator<char>_> local_1310;
  string local_12f8 [32];
  cmCTestLogWrite local_12d8;
  undefined1 local_12c8 [8];
  ostringstream cmCTestLog_msg_5;
  undefined1 local_1150 [8];
  cmCTestSubmitHandlerVectorOfChar chunkDebug;
  cmCTestSubmitHandlerVectorOfChar chunk;
  undefined1 local_1100 [8];
  ostringstream cmCTestLog_msg_4;
  unsigned_long filelen;
  string local_f78 [32];
  undefined1 local_f58 [8];
  ostringstream cmCTestLog_msg_3;
  string local_de0;
  allocator<char> local_db9;
  string local_db8;
  allocator<char> local_d91;
  string local_d90;
  string local_d70;
  allocator<char> local_d49;
  string local_d48;
  char *local_d28;
  char *subproject;
  cmake *cm;
  cmCTestScriptHandler *ch;
  string local_cf0;
  string local_cd0;
  string local_cb0;
  allocator<char> local_c89;
  string local_c88;
  string local_c68;
  string local_c48;
  allocator<char> local_c21;
  string local_c20;
  string local_c00;
  string local_be0;
  undefined1 local_bc0 [8];
  cmCTestCurl ctest_curl;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b28;
  undefined1 local_b08 [8];
  string upload_as;
  string ofile;
  undefined1 local_aa8 [8];
  string remote_file;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_a68;
  byte local_a41;
  undefined1 local_a40 [7];
  bool initialize_cdash_buildid;
  string local_file;
  undefined1 local_a00 [8];
  ostringstream cmCTestLog_msg_2;
  string local_888 [32];
  undefined1 local_868 [8];
  ostringstream cmCTestLog_msg_1;
  string local_6f0;
  reference local_6d0;
  string *file;
  const_iterator __end1_2;
  const_iterator __begin1_2;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_2;
  string *arg;
  iterator __end1_1;
  iterator __begin1_1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1_1;
  undefined1 local_688 [6];
  bool verifyHostOff;
  bool verifyPeerOff;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  args;
  string local_668;
  undefined1 local_648 [8];
  string curlopt;
  ostringstream local_5f8 [8];
  ostringstream cmCTestLog_msg;
  string *h;
  iterator __end1;
  iterator __begin1;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range1;
  curl_slist *headers;
  char error_buffer [1024];
  FILE *local_50;
  FILE *ftpfile;
  CURLcode res;
  CURL *curl;
  string *url_local;
  string *remoteprefix_local;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *files_local;
  string *localprefix_local;
  cmCTestSubmitHandler *this_local;
  
  __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)curl_slist_append((curl_slist *)0x0,"Content-Type: text/xml");
  __end1 = std::
           vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           ::begin(&this->HttpHeaders);
  h = (string *)
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::end(&this->HttpHeaders);
  while (bVar4 = __gnu_cxx::operator!=
                           (&__end1,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                     *)&h), bVar4) {
    pbVar7 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1);
    std::__cxx11::ostringstream::ostringstream(local_5f8);
    poVar11 = std::operator<<((ostream *)local_5f8,"   Add HTTP Header: \"");
    poVar11 = std::operator<<(poVar11,(string *)pbVar7);
    poVar11 = std::operator<<(poVar11,"\"");
    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
    pcVar2 = (this->super_cmCTestGenericHandler).CTest;
    std::__cxx11::ostringstream::str();
    pcVar8 = (char *)std::__cxx11::string::c_str();
    cmCTest::Log(pcVar2,0,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                 ,0x96,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
    std::__cxx11::string::~string((string *)(curlopt.field_2._M_local_buf + 8));
    std::__cxx11::ostringstream::~ostringstream(local_5f8);
    pcVar8 = (char *)std::__cxx11::string::c_str();
    __range1 = (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)curl_slist_append((curl_slist *)__range1,pcVar8);
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1);
  }
  curl_global_init(3);
  pcVar2 = (this->super_cmCTestGenericHandler).CTest;
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_668,"CurlOptions",
             (allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  cmCTest::GetCTestConfiguration((string *)local_648,pcVar2,&local_668);
  std::__cxx11::string::~string((string *)&local_668);
  std::allocator<char>::~allocator
            ((allocator<char> *)
             ((long)&args.
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     ._M_impl.super__Vector_impl_data._M_end_of_storage + 7));
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            *)local_688);
  cmSystemTools::ExpandListArgument
            ((string *)local_648,
             (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              *)local_688,false);
  bVar4 = false;
  bVar3 = false;
  __end1_1 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_688);
  arg = (string *)
        std::
        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *)local_688);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1_1,
                            (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&arg), bVar5) {
    pbVar7 = __gnu_cxx::
             __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
             ::operator*(&__end1_1);
    bVar5 = std::operator==(pbVar7,"CURLOPT_SSL_VERIFYPEER_OFF");
    if (bVar5) {
      bVar4 = true;
    }
    bVar5 = std::operator==(pbVar7,"CURLOPT_SSL_VERIFYHOST_OFF");
    if (bVar5) {
      bVar3 = true;
    }
    __gnu_cxx::
    __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_1);
  }
  __end1_2 = std::
             vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             ::begin(files);
  file = (string *)
         std::
         vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
         ::end(files);
  while (bVar5 = __gnu_cxx::operator!=
                           (&__end1_2,
                            (__normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                             *)&file), bVar5) {
    local_6d0 = __gnu_cxx::
                __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                ::operator*(&__end1_2);
    data = curl_easy_init();
    if (data != (CURL_conflict *)0x0) {
      cmCurlSetCAInfo_abi_cxx11_(&local_6f0,data,(char *)0x0);
      std::__cxx11::string::~string((string *)&local_6f0);
      if (bVar4) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_868);
        std::operator<<((ostream *)local_868,"  Set CURLOPT_SSL_VERIFYPEER to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb1,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string(local_888);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_868);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYPEER,0);
      }
      if (bVar3) {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_a00);
        std::operator<<((ostream *)local_a00,"  Set CURLOPT_SSL_VERIFYHOST to off\n");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0xb7,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string((string *)(local_file.field_2._M_local_buf + 8));
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_a00);
        curl_easy_setopt(data,CURLOPT_SSL_VERIFYHOST,0);
      }
      if (0 < this->HTTPProxyType) {
        uVar9 = std::__cxx11::string::c_str();
        curl_easy_setopt(data,CURLOPT_PROXY,uVar9);
        if (this->HTTPProxyType == 2) {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,4);
        }
        else if (this->HTTPProxyType == 3) {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,5);
        }
        else {
          curl_easy_setopt(data,CURLOPT_PROXYTYPE,0);
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            uVar9 = std::__cxx11::string::c_str();
            curl_easy_setopt(data,CURLOPT_PROXYUSERPWD,uVar9);
          }
        }
      }
      bVar5 = cmCTest::ShouldUseHTTP10((this->super_cmCTestGenericHandler).CTest);
      if (bVar5) {
        curl_easy_setopt(data,CURLOPT_HTTP_VERSION,1);
      }
      curl_easy_setopt(data,CURLOPT_FAILONERROR,1);
      curl_easy_setopt(data,CURLOPT_UPLOAD,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_LIMIT,1);
      curl_easy_setopt(data,CURLOPT_LOW_SPEED_TIME,0x78);
      curl_easy_setopt(data,CURLOPT_PUT,1);
      curl_easy_setopt(data,CURLOPT_VERBOSE,1);
      curl_easy_setopt(data,CURLOPT_HTTPHEADER,__range1);
      std::__cxx11::string::string((string *)local_a40,(string *)local_6d0);
      local_a41 = 0;
      bVar5 = cmsys::SystemTools::FileExists((string *)local_a40);
      if (!bVar5) {
        std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&remote_file.field_2 + 8),localprefix,"/");
        std::operator+(&local_a68,
                       (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                       ((long)&remote_file.field_2 + 8),local_6d0);
        std::__cxx11::string::operator=((string *)local_a40,(string *)&local_a68);
        std::__cxx11::string::~string((string *)&local_a68);
        std::__cxx11::string::~string((string *)(remote_file.field_2._M_local_buf + 8));
        local_a41 = 1;
      }
      cmsys::SystemTools::GetFilenameName((string *)((long)&ofile.field_2 + 8),local_6d0);
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_aa8,
                     remoteprefix,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&ofile.field_2 + 8));
      std::__cxx11::string::~string((string *)(ofile.field_2._M_local_buf + 8));
      poVar11 = std::operator<<(this->LogFile,"\tUpload file: ");
      poVar11 = std::operator<<(poVar11,(string *)local_a40);
      poVar11 = std::operator<<(poVar11," to ");
      poVar11 = std::operator<<(poVar11,(string *)local_aa8);
      std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
      cmSystemTools::EncodeURL((string *)((long)&upload_as.field_2 + 8),(string *)local_aa8,true);
      lVar12 = std::__cxx11::string::find((char)url,0x3f);
      __rhs = '&';
      if (lVar12 == -1) {
        __rhs = '?';
      }
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ctest_curl.TimeOutSeconds,url,__rhs);
      std::operator+(&local_b28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     &ctest_curl.TimeOutSeconds,"FileName=");
      std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_b08,
                     &local_b28,
                     (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                     ((long)&upload_as.field_2 + 8));
      std::__cxx11::string::~string((string *)&local_b28);
      std::__cxx11::string::~string((string *)&ctest_curl.TimeOutSeconds);
      if ((local_a41 & 1) != 0) {
        cmCTestCurl::cmCTestCurl((cmCTestCurl *)local_bc0,(this->super_cmCTestGenericHandler).CTest)
        ;
        std::__cxx11::string::operator+=((string *)local_b08,"&build=");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>
                  ((string *)&local_c20,"BuildName",&local_c21);
        cmCTest::GetCTestConfiguration(&local_c00,pcVar2,&local_c20);
        cmCTestCurl::Escape(&local_be0,(cmCTestCurl *)local_bc0,&local_c00);
        std::__cxx11::string::operator+=((string *)local_b08,(string *)&local_be0);
        std::__cxx11::string::~string((string *)&local_be0);
        std::__cxx11::string::~string((string *)&local_c00);
        std::__cxx11::string::~string((string *)&local_c20);
        std::allocator<char>::~allocator(&local_c21);
        std::__cxx11::string::operator+=((string *)local_b08,"&site=");
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::allocator<char>::allocator();
        std::__cxx11::string::string<std::allocator<char>>((string *)&local_c88,"Site",&local_c89);
        cmCTest::GetCTestConfiguration(&local_c68,pcVar2,&local_c88);
        cmCTestCurl::Escape(&local_c48,(cmCTestCurl *)local_bc0,&local_c68);
        std::__cxx11::string::operator+=((string *)local_b08,(string *)&local_c48);
        std::__cxx11::string::~string((string *)&local_c48);
        std::__cxx11::string::~string((string *)&local_c68);
        std::__cxx11::string::~string((string *)&local_c88);
        std::allocator<char>::~allocator(&local_c89);
        std::__cxx11::string::operator+=((string *)local_b08,"&stamp=");
        cmCTest::GetCurrentTag_abi_cxx11_(&local_cd0,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_cb0,(cmCTestCurl *)local_bc0,&local_cd0);
        std::__cxx11::string::operator+=((string *)local_b08,(string *)&local_cb0);
        std::__cxx11::string::~string((string *)&local_cb0);
        std::__cxx11::string::~string((string *)&local_cd0);
        std::__cxx11::string::operator+=((string *)local_b08,"-");
        cmCTest::GetTestModelString_abi_cxx11_
                  ((string *)&ch,(this->super_cmCTestGenericHandler).CTest);
        cmCTestCurl::Escape(&local_cf0,(cmCTestCurl *)local_bc0,(string *)&ch);
        std::__cxx11::string::operator+=((string *)local_b08,(string *)&local_cf0);
        std::__cxx11::string::~string((string *)&local_cf0);
        std::__cxx11::string::~string((string *)&ch);
        cm = (cmake *)cmCTest::GetScriptHandler((this->super_cmCTestGenericHandler).CTest);
        subproject = (char *)cmCTestScriptHandler::GetCMake((cmCTestScriptHandler *)cm);
        if ((cmake *)subproject != (cmake *)0x0) {
          this_00 = cmake::GetState((cmake *)subproject);
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_d48,"SubProject",&local_d49);
          pcVar8 = cmState::GetGlobalProperty(this_00,&local_d48);
          std::__cxx11::string::~string((string *)&local_d48);
          std::allocator<char>::~allocator(&local_d49);
          local_d28 = pcVar8;
          if (pcVar8 != (char *)0x0) {
            std::__cxx11::string::operator+=((string *)local_b08,"&subproject=");
            pcVar8 = local_d28;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_d90,pcVar8,&local_d91);
            cmCTestCurl::Escape(&local_d70,(cmCTestCurl *)local_bc0,&local_d90);
            std::__cxx11::string::operator+=((string *)local_b08,(string *)&local_d70);
            std::__cxx11::string::~string((string *)&local_d70);
            std::__cxx11::string::~string((string *)&local_d90);
            std::allocator<char>::~allocator(&local_d91);
          }
        }
        cmCTestCurl::~cmCTestCurl((cmCTestCurl *)local_bc0);
      }
      std::__cxx11::string::operator+=((string *)local_b08,"&MD5=");
      std::allocator<char>::allocator();
      std::__cxx11::string::string<std::allocator<char>>
                ((string *)&local_db8,"InternalTest",&local_db9);
      pcVar8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_db8);
      bVar5 = cmSystemTools::IsOn(pcVar8);
      std::__cxx11::string::~string((string *)&local_db8);
      std::allocator<char>::~allocator(&local_db9);
      if (bVar5) {
        std::__cxx11::string::operator+=((string *)local_b08,"bad_md5sum");
      }
      else {
        cmSystemTools::ComputeFileHash(&local_de0,(string *)local_a40,AlgoMD5);
        std::__cxx11::string::operator+=((string *)local_b08,(string *)&local_de0);
        std::__cxx11::string::~string((string *)&local_de0);
      }
      bVar5 = std::operator==(local_6d0,"Done.xml");
      if (bVar5) {
        cmCTest::GenerateDoneFile((this->super_cmCTestGenericHandler).CTest);
      }
      bVar5 = cmsys::SystemTools::FileExists((string *)local_a40);
      if (bVar5) {
        uVar13 = cmsys::SystemTools::FileLength((string *)local_a40);
        local_50 = (FILE *)cmsys::SystemTools::Fopen((string *)local_a40,"rb");
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1100);
        poVar11 = std::operator<<((ostream *)local_1100,"   Upload file: ");
        poVar11 = std::operator<<(poVar11,(string *)local_a40);
        poVar11 = std::operator<<(poVar11," to ");
        poVar11 = std::operator<<(poVar11,(string *)local_b08);
        poVar11 = std::operator<<(poVar11," Size: ");
        pvVar14 = (void *)std::ostream::operator<<(poVar11,uVar13);
        std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,5,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x130,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
        std::__cxx11::string::~string
                  ((string *)
                   &chunk.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1100);
        uVar9 = std::__cxx11::string::c_str();
        curl_easy_setopt(data,CURLOPT_URL,uVar9);
        curl_easy_setopt(data,CURLOPT_HTTPAUTH,0xffffffffffffffef);
        curl_easy_setopt(data,CURLOPT_READDATA,local_50);
        curl_easy_setopt(data,CURLOPT_INFILESIZE,uVar13);
        curl_easy_setopt(data,CURLOPT_ERRORBUFFER,&headers);
        curl_easy_setopt(data,CURLOPT_WRITEFUNCTION,cmCTestSubmitHandlerWriteMemoryCallback);
        curl_easy_setopt(data,CURLOPT_DEBUGFUNCTION,cmCTestSubmitHandlerCurlDebugCallback);
        puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)puVar1);
        std::vector<char,_std::allocator<char>_>::vector
                  ((vector<char,_std::allocator<char>_> *)local_1150);
        curl_easy_setopt(data,CURLOPT_WRITEDATA,puVar1);
        curl_easy_setopt(data,CURLOPT_DEBUGDATA,local_1150);
        ftpfile._4_4_ = curl_easy_perform(data);
        bVar5 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)
                           &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                            field_0x10);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_12c8);
          poVar11 = std::operator<<((ostream *)local_12c8,"CURL output: [");
          puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)puVar1);
          sVar15 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)puVar1);
          cmCTestLogWrite::cmCTestLogWrite(&local_12d8,pcVar8,sVar15);
          poVar11 = ::operator<<(poVar11,&local_12d8);
          poVar11 = std::operator<<(poVar11,"]");
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x156,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_12f8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_12c8);
          std::vector<char,_std::allocator<char>_>::vector
                    (&local_1310,
                     (vector<char,_std::allocator<char>_> *)
                     &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10)
          ;
          ParseResponse(this,&local_1310);
          std::vector<char,_std::allocator<char>_>::~vector(&local_1310);
        }
        bVar5 = std::vector<char,_std::allocator<char>_>::empty
                          ((vector<char,_std::allocator<char>_> *)local_1150);
        if (!bVar5) {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1488);
          poVar11 = std::operator<<((ostream *)local_1488,"CURL debug output: [");
          pcVar8 = std::vector<char,_std::allocator<char>_>::data
                             ((vector<char,_std::allocator<char>_> *)local_1150);
          sVar15 = std::vector<char,_std::allocator<char>_>::size
                             ((vector<char,_std::allocator<char>_> *)local_1150);
          cmCTestLogWrite::cmCTestLogWrite(&local_1498,pcVar8,sVar15);
          poVar11 = ::operator<<(poVar11,&local_1498);
          poVar11 = std::operator<<(poVar11,"]");
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,0,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x15f,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string((string *)(retryDelay.field_2._M_local_buf + 8));
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1488);
        }
        if ((ftpfile._4_4_ != CURLE_OK) || ((this->HasErrors & 1U) != 0)) {
          std::allocator<char>::allocator();
          retryCount.field_2._M_local_buf[0xe] = '\0';
          retryCount.field_2._M_local_buf[0xd] = '\0';
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_14f8,"RetryDelay",&local_14f9);
          pcVar8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_14f8);
          if (pcVar8 == (char *)0x0) {
            local_2408 = "";
          }
          else {
            std::allocator<char>::allocator();
            retryCount.field_2._M_local_buf[0xe] = '\x01';
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1520,"RetryDelay",
                       (allocator<char> *)(retryCount.field_2._M_local_buf + 0xf));
            retryCount.field_2._M_local_buf[0xd] = '\x01';
            local_2408 = cmCTestGenericHandler::GetOption
                                   (&this->super_cmCTestGenericHandler,&local_1520);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_14d8,local_2408,
                     (allocator<char> *)(retryCount.field_2._M_local_buf + 0xc));
          std::allocator<char>::~allocator
                    ((allocator<char> *)(retryCount.field_2._M_local_buf + 0xc));
          if ((retryCount.field_2._M_local_buf[0xd] & 1U) != 0) {
            std::__cxx11::string::~string((string *)&local_1520);
          }
          if ((retryCount.field_2._M_local_buf[0xe] & 1U) != 0) {
            std::allocator<char>::~allocator
                      ((allocator<char> *)(retryCount.field_2._M_local_buf + 0xf));
          }
          std::__cxx11::string::~string((string *)&local_14f8);
          std::allocator<char>::~allocator(&local_14f9);
          std::allocator<char>::allocator();
          delay.__r._6_1_ = 0;
          delay.__r._5_1_ = 0;
          std::__cxx11::string::string<std::allocator<char>>
                    ((string *)&local_1568,"RetryCount",&local_1569);
          pcVar8 = cmCTestGenericHandler::GetOption(&this->super_cmCTestGenericHandler,&local_1568);
          if (pcVar8 == (char *)0x0) {
            local_2440 = "";
          }
          else {
            std::allocator<char>::allocator();
            delay.__r._6_1_ = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&local_1590,"RetryCount",(allocator<char> *)((long)&delay.__r + 7))
            ;
            delay.__r._5_1_ = 1;
            local_2440 = cmCTestGenericHandler::GetOption
                                   (&this->super_cmCTestGenericHandler,&local_1590);
          }
          std::allocator<char>::allocator();
          std::__cxx11::string::string<std::allocator<char>>
                    (local_1548,local_2440,(allocator<char> *)((long)&delay.__r + 4));
          std::allocator<char>::~allocator((allocator<char> *)((long)&delay.__r + 4));
          if ((delay.__r._5_1_ & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_1590);
          }
          if ((delay.__r._6_1_ & 1) != 0) {
            std::allocator<char>::~allocator((allocator<char> *)((long)&delay.__r + 7));
          }
          std::__cxx11::string::~string((string *)&local_1568);
          std::allocator<char>::~allocator(&local_1569);
          uVar10 = std::__cxx11::string::empty();
          local_15ea = 0;
          local_15eb = 0;
          local_15ec = 0;
          if ((uVar10 & 1) == 0) {
            pcVar8 = (char *)std::__cxx11::string::c_str();
            local_2474 = atoi(pcVar8);
          }
          else {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::allocator<char>::allocator();
            local_15ea = 1;
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&count,"CTestSubmitRetryDelay",&local_15e9);
            local_15eb = 1;
            cmCTest::GetCTestConfiguration(&local_15c8,pcVar2,(string *)&count);
            local_15ec = 1;
            pcVar8 = (char *)std::__cxx11::string::c_str();
            local_2474 = atoi(pcVar8);
          }
          local_15a4 = local_2474;
          std::chrono::duration<double,std::ratio<1l,1l>>::duration<int,void>
                    ((duration<double,std::ratio<1l,1l>> *)&local_15a0,&local_15a4);
          if ((local_15ec & 1) != 0) {
            std::__cxx11::string::~string((string *)&local_15c8);
          }
          if ((local_15eb & 1) != 0) {
            std::__cxx11::string::~string((string *)&count);
          }
          if ((local_15ea & 1) != 0) {
            std::allocator<char>::~allocator(&local_15e9);
          }
          uVar10 = std::__cxx11::string::empty();
          if ((uVar10 & 1) == 0) {
            pcVar8 = (char *)std::__cxx11::string::c_str();
            local_15f0 = atoi(pcVar8);
          }
          else {
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::allocator<char>::allocator();
            std::__cxx11::string::string<std::allocator<char>>
                      ((string *)&i,"CTestSubmitRetryCount",&local_1631);
            cmCTest::GetCTestConfiguration(&local_1610,pcVar2,(string *)&i);
            pcVar8 = (char *)std::__cxx11::string::c_str();
            iVar6 = atoi(pcVar8);
            std::__cxx11::string::~string((string *)&local_1610);
            std::__cxx11::string::~string((string *)&i);
            std::allocator<char>::~allocator(&local_1631);
            local_15f0 = iVar6;
          }
          for (local_1638 = 0; local_1638 < local_15f0; local_1638 = local_1638 + 1) {
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_17b0);
            poVar11 = std::operator<<((ostream *)local_17b0,"   Submit failed, waiting ");
            rVar16 = std::chrono::duration<double,_std::ratio<1L,_1L>_>::count(&local_15a0);
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,rVar16);
            std::operator<<(poVar11," seconds...\n");
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x17a,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string((string *)&stop);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_17b0);
            local_17e0.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
            local_17d8 = std::chrono::operator+(&local_17e0,&local_15a0);
            while( true ) {
              local_17e8.__d.__r = (duration)std::chrono::_V2::steady_clock::now();
              bVar5 = std::chrono::operator<(&local_17e8,&local_17d8);
              if (!bVar5) break;
              cmsys::SystemTools::Delay(100);
            }
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1960);
            poVar11 = std::operator<<((ostream *)local_1960,"   Retry submission: Attempt ");
            poVar11 = (ostream *)std::ostream::operator<<(poVar11,local_1638 + 1);
            poVar11 = std::operator<<(poVar11," of ");
            pvVar14 = (void *)std::ostream::operator<<(poVar11,local_15f0);
            std::ostream::operator<<(pvVar14,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,2,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x184,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
            std::__cxx11::string::~string(local_1980);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1960);
            fclose(local_50);
            local_50 = (FILE *)cmsys::SystemTools::Fopen((string *)local_a40,"rb");
            curl_easy_setopt(data,CURLOPT_READDATA,local_50);
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)
                       &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10);
            std::vector<char,_std::allocator<char>_>::clear
                      ((vector<char,_std::allocator<char>_> *)local_1150);
            this->HasErrors = false;
            ftpfile._4_4_ = curl_easy_perform(data);
            bVar5 = std::vector<char,_std::allocator<char>_>::empty
                              ((vector<char,_std::allocator<char>_> *)
                               &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                                field_0x10);
            if (!bVar5) {
              std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1af8);
              poVar11 = std::operator<<((ostream *)local_1af8,"CURL output: [");
              puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                        field_0x10;
              pcVar8 = std::vector<char,_std::allocator<char>_>::data
                                 ((vector<char,_std::allocator<char>_> *)puVar1);
              sVar15 = std::vector<char,_std::allocator<char>_>::size
                                 ((vector<char,_std::allocator<char>_> *)puVar1);
              cmCTestLogWrite::cmCTestLogWrite(&local_1b08,pcVar8,sVar15);
              poVar11 = ::operator<<(poVar11,&local_1b08);
              poVar11 = std::operator<<(poVar11,"]");
              std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
              pcVar2 = (this->super_cmCTestGenericHandler).CTest;
              std::__cxx11::ostringstream::str();
              pcVar8 = (char *)std::__cxx11::string::c_str();
              cmCTest::Log(pcVar2,0,
                           "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                           ,0x195,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
              std::__cxx11::string::~string(local_1b28);
              std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1af8);
              std::vector<char,_std::allocator<char>_>::vector
                        (&local_1b40,
                         (vector<char,_std::allocator<char>_> *)
                         &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          field_0x10);
              ParseResponse(this,&local_1b40);
              std::vector<char,_std::allocator<char>_>::~vector(&local_1b40);
            }
            if ((ftpfile._4_4_ == CURLE_OK) && ((this->HasErrors & 1U) == 0)) break;
          }
          std::__cxx11::string::~string(local_1548);
          std::__cxx11::string::~string(local_14d8);
        }
        fclose(local_50);
        if (ftpfile._4_4_ == CURLE_OK) {
          curl_easy_cleanup(data);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_21a0);
          std::operator+(&local_21c0,"   Uploaded: ",
                         (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                         local_a40);
          poVar11 = std::operator<<((ostream *)local_21a0,(string *)&local_21c0);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          std::__cxx11::string::~string((string *)&local_21c0);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1bd,pcVar8,(bool)((this->super_cmCTestGenericHandler).Quiet & 1));
          std::__cxx11::string::~string(local_21e0);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_21a0);
          bVar5 = false;
        }
        else {
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1cb8);
          poVar11 = std::operator<<((ostream *)local_1cb8,"   Error when uploading file: ");
          poVar11 = std::operator<<(poVar11,(string *)local_a40);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1a3,pcVar8,false);
          std::__cxx11::string::~string(local_1cd8);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1cb8);
          std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1e50);
          poVar11 = std::operator<<((ostream *)local_1e50,"   Error message was: ");
          poVar11 = std::operator<<(poVar11,(char *)&headers);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          pcVar2 = (this->super_cmCTestGenericHandler).CTest;
          std::__cxx11::ostringstream::str();
          pcVar8 = (char *)std::__cxx11::string::c_str();
          cmCTest::Log(pcVar2,7,
                       "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                       ,0x1a5,pcVar8,false);
          std::__cxx11::string::~string(local_1e70);
          std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1e50);
          poVar11 = std::operator<<(this->LogFile,"   Error when uploading file: ");
          poVar11 = std::operator<<(poVar11,(string *)local_a40);
          poVar11 = (ostream *)
                    std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          poVar11 = std::operator<<(poVar11,"   Error message was: ");
          poVar11 = std::operator<<(poVar11,(char *)&headers);
          std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
          bVar5 = std::vector<char,_std::allocator<char>_>::empty
                            ((vector<char,_std::allocator<char>_> *)
                             &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                              field_0x10);
          if (!bVar5) {
            poVar11 = std::operator<<(this->LogFile,"   Curl output was: ");
            puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            sVar15 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            cmCTestLogWrite::cmCTestLogWrite(&local_1e80,pcVar8,sVar15);
            poVar11 = ::operator<<(poVar11,&local_1e80);
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1ff8);
            poVar11 = std::operator<<((ostream *)local_1ff8,"CURL output: [");
            puVar1 = &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10;
            pcVar8 = std::vector<char,_std::allocator<char>_>::data
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            sVar15 = std::vector<char,_std::allocator<char>_>::size
                               ((vector<char,_std::allocator<char>_> *)puVar1);
            cmCTestLogWrite::cmCTestLogWrite(&local_2008,pcVar8,sVar15);
            poVar11 = ::operator<<(poVar11,&local_2008);
            poVar11 = std::operator<<(poVar11,"]");
            std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
            pcVar2 = (this->super_cmCTestGenericHandler).CTest;
            std::__cxx11::ostringstream::str();
            pcVar8 = (char *)std::__cxx11::string::c_str();
            cmCTest::Log(pcVar2,7,
                         "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                         ,0x1b2,pcVar8,false);
            std::__cxx11::string::~string(local_2028);
            std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1ff8);
          }
          curl_easy_cleanup(data);
          curl_slist_free_all((curl_slist *)__range1);
          curl_global_cleanup();
          this_local._7_1_ = 0;
          bVar5 = true;
        }
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)local_1150);
        std::vector<char,_std::allocator<char>_>::~vector
                  ((vector<char,_std::allocator<char>_> *)
                   &chunkDebug.super__Vector_base<char,_std::allocator<char>_>._M_impl.field_0x10);
      }
      else {
        std::__cxx11::ostringstream::ostringstream((ostringstream *)local_f58);
        poVar11 = std::operator<<((ostream *)local_f58,"   Cannot find file: ");
        poVar11 = std::operator<<(poVar11,(string *)local_a40);
        std::ostream::operator<<(poVar11,std::endl<char,std::char_traits<char>>);
        pcVar2 = (this->super_cmCTestGenericHandler).CTest;
        std::__cxx11::ostringstream::str();
        pcVar8 = (char *)std::__cxx11::string::c_str();
        cmCTest::Log(pcVar2,7,
                     "/workspace/llm4binary/github/license_all_cmakelists_1510/havogt[P]cmakels/cmakels/external/cmake/Source/CTest/cmCTestSubmitHandler.cxx"
                     ,0x123,pcVar8,false);
        std::__cxx11::string::~string(local_f78);
        std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_f58);
        curl_easy_cleanup(data);
        curl_slist_free_all((curl_slist *)__range1);
        curl_global_cleanup();
        this_local._7_1_ = 0;
        bVar5 = true;
      }
      std::__cxx11::string::~string((string *)local_b08);
      std::__cxx11::string::~string((string *)(upload_as.field_2._M_local_buf + 8));
      std::__cxx11::string::~string((string *)local_aa8);
      std::__cxx11::string::~string((string *)local_a40);
      if (bVar5) goto LAB_001d884f;
    }
    __gnu_cxx::
    __normal_iterator<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
    ::operator++(&__end1_2);
  }
  curl_slist_free_all((curl_slist *)__range1);
  curl_global_cleanup();
  this_local._7_1_ = 1;
LAB_001d884f:
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_688);
  std::__cxx11::string::~string((string *)local_648);
  return (bool)(this_local._7_1_ & 1);
}

Assistant:

bool cmCTestSubmitHandler::SubmitUsingHTTP(
  const std::string& localprefix, const std::vector<std::string>& files,
  const std::string& remoteprefix, const std::string& url)
{
  CURL* curl;
  CURLcode res;
  FILE* ftpfile;
  char error_buffer[1024];
  // Set Content-Type to satisfy fussy modsecurity rules.
  struct curl_slist* headers =
    ::curl_slist_append(nullptr, "Content-Type: text/xml");

  // Add any additional headers that the user specified.
  for (std::string const& h : this->HttpHeaders) {
    cmCTestOptionalLog(this->CTest, DEBUG,
                       "   Add HTTP Header: \"" << h << "\"" << std::endl,
                       this->Quiet);
    headers = ::curl_slist_append(headers, h.c_str());
  }

  /* In windows, this will init the winsock stuff */
  ::curl_global_init(CURL_GLOBAL_ALL);
  std::string curlopt(this->CTest->GetCTestConfiguration("CurlOptions"));
  std::vector<std::string> args;
  cmSystemTools::ExpandListArgument(curlopt, args);
  bool verifyPeerOff = false;
  bool verifyHostOff = false;
  for (std::string const& arg : args) {
    if (arg == "CURLOPT_SSL_VERIFYPEER_OFF") {
      verifyPeerOff = true;
    }
    if (arg == "CURLOPT_SSL_VERIFYHOST_OFF") {
      verifyHostOff = true;
    }
  }
  for (std::string const& file : files) {
    /* get a curl handle */
    curl = curl_easy_init();
    if (curl) {
      cmCurlSetCAInfo(curl);
      if (verifyPeerOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYPEER to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYPEER, 0);
      }
      if (verifyHostOff) {
        cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                           "  Set CURLOPT_SSL_VERIFYHOST to off\n",
                           this->Quiet);
        curl_easy_setopt(curl, CURLOPT_SSL_VERIFYHOST, 0);
      }

      // Using proxy
      if (this->HTTPProxyType > 0) {
        curl_easy_setopt(curl, CURLOPT_PROXY, this->HTTPProxy.c_str());
        switch (this->HTTPProxyType) {
          case 2:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS4);
            break;
          case 3:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_SOCKS5);
            break;
          default:
            curl_easy_setopt(curl, CURLOPT_PROXYTYPE, CURLPROXY_HTTP);
            if (!this->HTTPProxyAuth.empty()) {
              curl_easy_setopt(curl, CURLOPT_PROXYUSERPWD,
                               this->HTTPProxyAuth.c_str());
            }
        }
      }
      if (this->CTest->ShouldUseHTTP10()) {
        curl_easy_setopt(curl, CURLOPT_HTTP_VERSION, CURL_HTTP_VERSION_1_0);
      }
      // enable HTTP ERROR parsing
      curl_easy_setopt(curl, CURLOPT_FAILONERROR, 1);
      /* enable uploading */
      curl_easy_setopt(curl, CURLOPT_UPLOAD, 1);

      // if there is little to no activity for too long stop submitting
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_LIMIT, 1);
      ::curl_easy_setopt(curl, CURLOPT_LOW_SPEED_TIME,
                         SUBMIT_TIMEOUT_IN_SECONDS_DEFAULT);

      /* HTTP PUT please */
      ::curl_easy_setopt(curl, CURLOPT_PUT, 1);
      ::curl_easy_setopt(curl, CURLOPT_VERBOSE, 1);

      ::curl_easy_setopt(curl, CURLOPT_HTTPHEADER, headers);

      std::string local_file = file;
      bool initialize_cdash_buildid = false;
      if (!cmSystemTools::FileExists(local_file)) {
        local_file = localprefix + "/" + file;
        // If this file exists within the local Testing directory we assume
        // that it will be associated with the current build in CDash.
        initialize_cdash_buildid = true;
      }
      std::string remote_file =
        remoteprefix + cmSystemTools::GetFilenameName(file);

      *this->LogFile << "\tUpload file: " << local_file << " to "
                     << remote_file << std::endl;

      std::string ofile = cmSystemTools::EncodeURL(remote_file);
      std::string upload_as = url +
        ((url.find('?') == std::string::npos) ? '?' : '&') +
        "FileName=" + ofile;

      if (initialize_cdash_buildid) {
        // Provide extra arguments to CDash so that it can initialize and
        // return a buildid.
        cmCTestCurl ctest_curl(this->CTest);
        upload_as += "&build=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("BuildName"));
        upload_as += "&site=";
        upload_as +=
          ctest_curl.Escape(this->CTest->GetCTestConfiguration("Site"));
        upload_as += "&stamp=";
        upload_as += ctest_curl.Escape(this->CTest->GetCurrentTag());
        upload_as += "-";
        upload_as += ctest_curl.Escape(this->CTest->GetTestModelString());
        cmCTestScriptHandler* ch = this->CTest->GetScriptHandler();
        cmake* cm = ch->GetCMake();
        if (cm) {
          const char* subproject =
            cm->GetState()->GetGlobalProperty("SubProject");
          if (subproject) {
            upload_as += "&subproject=";
            upload_as += ctest_curl.Escape(subproject);
          }
        }
      }

      upload_as += "&MD5=";

      if (cmSystemTools::IsOn(this->GetOption("InternalTest"))) {
        upload_as += "bad_md5sum";
      } else {
        upload_as +=
          cmSystemTools::ComputeFileHash(local_file, cmCryptoHash::AlgoMD5);
      }

      // Generate Done.xml right before it is submitted.
      // The reason for this is two-fold:
      // 1) It must be generated after some other part has been submitted
      //    so we have a buildId to refer to in its contents.
      // 2) By generating Done.xml here its timestamp will be as late as
      //    possible. This gives us a more accurate record of how long the
      //    entire build took to complete.
      if (file == "Done.xml") {
        this->CTest->GenerateDoneFile();
      }

      if (!cmSystemTools::FileExists(local_file)) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Cannot find file: " << local_file << std::endl);
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      unsigned long filelen = cmSystemTools::FileLength(local_file);

      ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
      cmCTestOptionalLog(this->CTest, HANDLER_VERBOSE_OUTPUT,
                         "   Upload file: " << local_file << " to "
                                            << upload_as << " Size: "
                                            << filelen << std::endl,
                         this->Quiet);

      // specify target
      ::curl_easy_setopt(curl, CURLOPT_URL, upload_as.c_str());

      // CURLAUTH_BASIC is default, and here we allow additional methods,
      // including more secure ones
      ::curl_easy_setopt(curl, CURLOPT_HTTPAUTH, CURLAUTH_ANY);

      // now specify which file to upload
      ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

      // and give the size of the upload (optional)
      ::curl_easy_setopt(curl, CURLOPT_INFILESIZE, static_cast<long>(filelen));

      // and give curl the buffer for errors
      ::curl_easy_setopt(curl, CURLOPT_ERRORBUFFER, &error_buffer);

      // specify handler for output
      ::curl_easy_setopt(curl, CURLOPT_WRITEFUNCTION,
                         cmCTestSubmitHandlerWriteMemoryCallback);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGFUNCTION,
                         cmCTestSubmitHandlerCurlDebugCallback);

      /* we pass our 'chunk' struct to the callback function */
      cmCTestSubmitHandlerVectorOfChar chunk;
      cmCTestSubmitHandlerVectorOfChar chunkDebug;
      ::curl_easy_setopt(curl, CURLOPT_FILE, &chunk);
      ::curl_easy_setopt(curl, CURLOPT_DEBUGDATA, &chunkDebug);

      // Now run off and do what you've been told!
      res = ::curl_easy_perform(curl);

      if (!chunk.empty()) {
        cmCTestOptionalLog(this->CTest, DEBUG,
                           "CURL output: ["
                             << cmCTestLogWrite(chunk.data(), chunk.size())
                             << "]" << std::endl,
                           this->Quiet);
        this->ParseResponse(chunk);
      }
      if (!chunkDebug.empty()) {
        cmCTestOptionalLog(
          this->CTest, DEBUG,
          "CURL debug output: ["
            << cmCTestLogWrite(chunkDebug.data(), chunkDebug.size()) << "]"
            << std::endl,
          this->Quiet);
      }

      // If curl failed for any reason, or checksum fails, wait and retry
      //
      if (res != CURLE_OK || this->HasErrors) {
        std::string retryDelay = this->GetOption("RetryDelay") == nullptr
          ? ""
          : this->GetOption("RetryDelay");
        std::string retryCount = this->GetOption("RetryCount") == nullptr
          ? ""
          : this->GetOption("RetryCount");

        auto delay = cmDuration(
          retryDelay.empty()
            ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryDelay")
                     .c_str())
            : atoi(retryDelay.c_str()));
        int count = retryCount.empty()
          ? atoi(this->CTest->GetCTestConfiguration("CTestSubmitRetryCount")
                   .c_str())
          : atoi(retryCount.c_str());

        for (int i = 0; i < count; i++) {
          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Submit failed, waiting " << delay.count()
                                                          << " seconds...\n",
                             this->Quiet);

          auto stop = std::chrono::steady_clock::now() + delay;
          while (std::chrono::steady_clock::now() < stop) {
            cmSystemTools::Delay(100);
          }

          cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                             "   Retry submission: Attempt "
                               << (i + 1) << " of " << count << std::endl,
                             this->Quiet);

          ::fclose(ftpfile);
          ftpfile = cmsys::SystemTools::Fopen(local_file, "rb");
          ::curl_easy_setopt(curl, CURLOPT_INFILE, ftpfile);

          chunk.clear();
          chunkDebug.clear();
          this->HasErrors = false;

          res = ::curl_easy_perform(curl);

          if (!chunk.empty()) {
            cmCTestOptionalLog(this->CTest, DEBUG,
                               "CURL output: ["
                                 << cmCTestLogWrite(chunk.data(), chunk.size())
                                 << "]" << std::endl,
                               this->Quiet);
            this->ParseResponse(chunk);
          }

          if (res == CURLE_OK && !this->HasErrors) {
            break;
          }
        }
      }

      fclose(ftpfile);
      if (res) {
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error when uploading file: " << local_file
                                                    << std::endl);
        cmCTestLog(this->CTest, ERROR_MESSAGE,
                   "   Error message was: " << error_buffer << std::endl);
        *this->LogFile << "   Error when uploading file: " << local_file
                       << std::endl
                       << "   Error message was: " << error_buffer
                       << std::endl;
        // avoid deref of begin for zero size array
        if (!chunk.empty()) {
          *this->LogFile << "   Curl output was: "
                         << cmCTestLogWrite(chunk.data(), chunk.size())
                         << std::endl;
          cmCTestLog(this->CTest, ERROR_MESSAGE,
                     "CURL output: ["
                       << cmCTestLogWrite(chunk.data(), chunk.size()) << "]"
                       << std::endl);
        }
        ::curl_easy_cleanup(curl);
        ::curl_slist_free_all(headers);
        ::curl_global_cleanup();
        return false;
      }
      // always cleanup
      ::curl_easy_cleanup(curl);
      cmCTestOptionalLog(this->CTest, HANDLER_OUTPUT,
                         "   Uploaded: " + local_file << std::endl,
                         this->Quiet);
    }
  }
  ::curl_slist_free_all(headers);
  ::curl_global_cleanup();
  return true;
}